

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O0

flatcc_builder_ref_t flatcc_builder_end_buffer(flatcc_builder_t *B,flatcc_builder_ref_t root)

{
  ushort uVar1;
  flatbuffers_uoffset_t fVar2;
  flatcc_builder_buffer_flags_t flags;
  flatcc_builder_ref_t buffer_ref;
  flatcc_builder_ref_t root_local;
  flatcc_builder_t *B_local;
  
  uVar1 = B->buffer_flags;
  fVar2 = B->nest_id;
  if (B->frame->type == 1) {
    set_min_align(B,B->block_align);
    B_local._4_4_ =
         flatcc_builder_create_buffer
                   (B,(char *)&B->identifier,B->block_align,root,B->min_align,
                    uVar1 & 2 | (ushort)(fVar2 != 0));
    if (B_local._4_4_ == 0) {
      B_local._4_4_ = 0;
    }
    else {
      B->buffer_mark = (B->frame->container).table.pl_end;
      B->nest_id = (B->frame->container).buffer.nest_id;
      B->identifier = (B->frame->container).table.vs_end;
      B->buffer_flags = (B->frame->container).buffer.flags;
      B->block_align = (B->frame->container).buffer.block_align;
      exit_frame(B);
    }
    return B_local._4_4_;
  }
  __assert_fail("(B->frame[0].type) == flatcc_builder_buffer",
                "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                ,0x359,
                "flatcc_builder_ref_t flatcc_builder_end_buffer(flatcc_builder_t *, flatcc_builder_ref_t)"
               );
}

Assistant:

flatcc_builder_ref_t flatcc_builder_end_buffer(flatcc_builder_t *B, flatcc_builder_ref_t root)
{
    flatcc_builder_ref_t buffer_ref;
    flatcc_builder_buffer_flags_t flags;

    flags = (flatcc_builder_buffer_flags_t)B->buffer_flags & flatcc_builder_with_size;
    flags |= is_top_buffer(B) ? 0 : flatcc_builder_is_nested;
    check(frame(type) == flatcc_builder_buffer, "expected buffer frame");
    set_min_align(B, B->block_align);
    if (0 == (buffer_ref = flatcc_builder_create_buffer(B, (void *)&B->identifier,
            B->block_align, root, B->min_align, flags))) {
        return 0;
    }
    B->buffer_mark = frame(container.buffer.mark);
    B->nest_id = frame(container.buffer.nest_id);
    B->identifier = frame(container.buffer.identifier);
    B->buffer_flags = frame(container.buffer.flags);
    B->block_align = frame(container.buffer.block_align);

    exit_frame(B);
    return buffer_ref;
}